

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

int ssh2_rportfwd_cmp(void *av,void *bv)

{
  int iVar1;
  int i;
  ssh_rportfwd *b;
  ssh_rportfwd *a;
  void *bv_local;
  void *av_local;
  
  iVar1 = strcmp(*(char **)((long)av + 8),*(char **)((long)bv + 8));
  if (iVar1 == 0) {
    if (*bv < *av) {
      av_local._4_4_ = 1;
    }
    else if (*av < *bv) {
      av_local._4_4_ = -1;
    }
    else {
      av_local._4_4_ = 0;
    }
  }
  else {
    av_local._4_4_ = 1;
    if (iVar1 < 0) {
      av_local._4_4_ = -1;
    }
  }
  return av_local._4_4_;
}

Assistant:

static int ssh2_rportfwd_cmp(void *av, void *bv)
{
    struct ssh_rportfwd *a = (struct ssh_rportfwd *) av;
    struct ssh_rportfwd *b = (struct ssh_rportfwd *) bv;
    int i;
    if ( (i = strcmp(a->shost, b->shost)) != 0)
        return i < 0 ? -1 : +1;
    if (a->sport > b->sport)
        return +1;
    if (a->sport < b->sport)
        return -1;
    return 0;
}